

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  uint *puVar1;
  int iVar2;
  LogMessage *other;
  MessageLite *pMVar3;
  long lVar4;
  int iVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar2 = this->extensions_offset_;
    if (iVar2 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
      iVar2 = this->extensions_offset_;
    }
    pMVar3 = ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar2),field,
                        factory);
  }
  else {
    lVar4 = ((long)field - *(long *)(*(long *)(field + 0x38) + 0x30) >> 3) * -0x1111111111111111;
    iVar2 = (int)lVar4;
    iVar5 = iVar2 + 0x1f;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)(iVar5 >> 5) * 4 + (long)this->has_bits_offset_);
    *puVar1 = *puVar1 | 1 << ((byte)lVar4 & 0x1f);
    lVar4 = (long)this->offsets_[iVar2];
    pMVar3 = *(MessageLite **)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar4);
    if (pMVar3 == (MessageLite *)0x0) {
      pMVar3 = (MessageLite *)
               (**(code **)(**(long **)((long)&(this->default_instance_->super_MessageLite).
                                               _vptr_MessageLite + lVar4) + 0x18))();
      *(MessageLite **)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar4) = pMVar3;
    }
  }
  return (Message *)pMVar3;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;
    Message** result_holder = MutableField<Message*>(message, field);
    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New();
    }
    result = *result_holder;
    return result;
  }
}